

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

void glu::TextureTestUtil::computeQuadTexCoordCubeArray
               (vector<float,_std::allocator<float>_> *dst,CubeFace face,Vec2 *bottomLeft,
               Vec2 *topRight,Vec2 *layerRange)

{
  float fVar1;
  float fVar2;
  float fVar3;
  pointer pfVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  
  if (face < CUBEFACE_LAST) {
    fVar1 = layerRange->m_data[0];
    fVar9 = layerRange->m_data[1];
    uVar5 = (ulong)face;
    uVar7 = (ulong)*(uint *)(&DAT_00b8e748 + uVar5 * 4);
    fVar8 = *(float *)(&DAT_00b8e760 + uVar5 * 4);
    fVar2 = *(float *)(&DAT_00b8e778 + uVar5 * 4);
    fVar3 = *(float *)(&DAT_00b8e790 + uVar5 * 4);
    uVar6 = (ulong)*(uint *)(&DAT_00b8e7a8 + uVar5 * 4);
    uVar5 = (ulong)*(uint *)(&DAT_00b8e7c0 + uVar5 * 4);
    std::vector<float,_std::allocator<float>_>::resize(dst,0x10);
    pfVar4 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar4[uVar7] = fVar3;
    pfVar4[uVar7 + 4] = fVar3;
    pfVar4[uVar7 + 8] = fVar3;
    pfVar4[uVar7 + 0xc] = fVar3;
    pfVar4[uVar5] = bottomLeft->m_data[0] * fVar8;
    pfVar4[uVar5 + 4] = bottomLeft->m_data[0] * fVar8;
    pfVar4[uVar5 + 8] = topRight->m_data[0] * fVar8;
    pfVar4[uVar5 + 0xc] = fVar8 * topRight->m_data[0];
    pfVar4[uVar6] = bottomLeft->m_data[1] * fVar2;
    pfVar4[uVar6 + 4] = topRight->m_data[1] * fVar2;
    pfVar4[uVar6 + 8] = bottomLeft->m_data[1] * fVar2;
    pfVar4[uVar6 + 0xc] = fVar2 * topRight->m_data[1];
    pfVar4[3] = fVar1;
    fVar8 = fVar1 * 0.5 + fVar9 * 0.5;
    if ((fVar1 == fVar9) && (!NAN(fVar1) && !NAN(fVar9))) {
      fVar8 = fVar1;
    }
    if ((fVar1 == fVar9) && (!NAN(fVar1) && !NAN(fVar9))) {
      fVar9 = fVar1;
    }
    pfVar4[7] = fVar8;
    pfVar4[0xb] = fVar8;
    pfVar4[0xf] = fVar9;
  }
  return;
}

Assistant:

void computeQuadTexCoordCubeArray (std::vector<float>& dst, tcu::CubeFace face, const tcu::Vec2& bottomLeft, const tcu::Vec2& topRight, const tcu::Vec2& layerRange)
{
	int			sRow	= 0;
	int			tRow	= 0;
	int			mRow	= 0;
	const int	qRow	= 3;
	float		sSign	= 1.0f;
	float		tSign	= 1.0f;
	float		mSign	= 1.0f;
	const float	l0		= layerRange.x();
	const float	l1		= layerRange.y();

	switch (face)
	{
		case tcu::CUBEFACE_NEGATIVE_X: mRow = 0; sRow = 2; tRow = 1; mSign = -1.0f;				   tSign = -1.0f;	break;
		case tcu::CUBEFACE_POSITIVE_X: mRow = 0; sRow = 2; tRow = 1;				sSign = -1.0f; tSign = -1.0f;	break;
		case tcu::CUBEFACE_NEGATIVE_Y: mRow = 1; sRow = 0; tRow = 2; mSign = -1.0f;				   tSign = -1.0f;	break;
		case tcu::CUBEFACE_POSITIVE_Y: mRow = 1; sRow = 0; tRow = 2;												break;
		case tcu::CUBEFACE_NEGATIVE_Z: mRow = 2; sRow = 0; tRow = 1; mSign = -1.0f; sSign = -1.0f; tSign = -1.0f;	break;
		case tcu::CUBEFACE_POSITIVE_Z: mRow = 2; sRow = 0; tRow = 1;							   tSign = -1.0f;	break;
		default:
			DE_ASSERT(DE_FALSE);
			return;
	}

	dst.resize(4*4);

	dst[ 0+mRow] = mSign;
	dst[ 4+mRow] = mSign;
	dst[ 8+mRow] = mSign;
	dst[12+mRow] = mSign;

	dst[ 0+sRow] = sSign * bottomLeft.x();
	dst[ 4+sRow] = sSign * bottomLeft.x();
	dst[ 8+sRow] = sSign * topRight.x();
	dst[12+sRow] = sSign * topRight.x();

	dst[ 0+tRow] = tSign * bottomLeft.y();
	dst[ 4+tRow] = tSign * topRight.y();
	dst[ 8+tRow] = tSign * bottomLeft.y();
	dst[12+tRow] = tSign * topRight.y();

	if (l0 != l1)
	{
		dst[ 0+qRow] = l0;
		dst[ 4+qRow] = l0*0.5f + l1*0.5f;
		dst[ 8+qRow] = l0*0.5f + l1*0.5f;
		dst[12+qRow] = l1;
	}
	else
	{
		dst[ 0+qRow] = l0;
		dst[ 4+qRow] = l0;
		dst[ 8+qRow] = l0;
		dst[12+qRow] = l0;
	}
}